

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osssb_cursor_to_default_pos(void)

{
  osgen_win_t *win;
  
  if (os_f_plain == 0) {
    if (S_sbmode_win == (osgen_txtwin_t *)0x0) {
      if (S_special_cursor_pos == 0) {
        if (S_default_win != (osgen_txtwin_t *)0x0) {
          ossloc(0,0x2237c3);
        }
      }
      else {
        ossloc(0,0x223781);
      }
    }
    else {
      ossloc(0,0x223765);
    }
  }
  return;
}

Assistant:

void osssb_cursor_to_default_pos(void)
{
    osgen_win_t *win;

    /* if we're in plain mode, ignore it */
    if (os_f_plain)
        return;

    /* if we're using a special cursor position, do nothing */
    if (S_sbmode_win != 0)
    {
        /* locate at the scrollback mode line */
        ossloc(S_sbmode_win->base.winy - 1, S_sbmode_win->base.winx);
    }
    else if (S_special_cursor_pos)
    {
        /* locate at the special cursor position */
        ossloc(S_special_cursor_y, S_special_cursor_x);
    }
    else
    {
        /* 
         *   if we have a default window, put the cursor at the last text
         *   position in the default window 
         */
        if ((win = &S_default_win->base) != 0)
            ossloc(win->winy + win->y - win->scrolly,
                   win->winx + win->x - win->scrollx);
    }
}